

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_iastore(ExecutionEngine *this)

{
  int iVar1;
  uint32_t uVar2;
  ValueType VVar3;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar4;
  anon_union_8_10_52016fac_for_data this_02;
  uint index;
  Value VVar5;
  Value VVar6;
  Value VVar7;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar5 = Frame::popTopOfOperandStack(this_01);
  if (VVar5.type != INT) {
    __assert_fail("value.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x607,"void ExecutionEngine::i_iastore()");
  }
  VVar6 = Frame::popTopOfOperandStack(this_01);
  if ((VVar6._0_8_ & 0xffffffff00000000) != 0x400000000) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x609,"void ExecutionEngine::i_iastore()");
  }
  VVar7 = Frame::popTopOfOperandStack(this_01);
  this_02 = VVar7.data;
  if ((VVar7._0_8_ & 0xffffffff00000000) != 0x900000000) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x60b,"void ExecutionEngine::i_iastore()");
  }
  iVar1 = (**((Object *)&(this_02.object)->_vptr_Object)->_vptr_Object)(this_02.longValue);
  if (iVar1 == 2) {
    uVar2 = ArrayObject::getSize((ArrayObject *)this_02.object);
    index = VVar6.data._0_4_;
    if ((-1 < (int)index) && (index < uVar2)) {
      VVar3 = ArrayObject::arrayContentType((ArrayObject *)this_02.object);
      if (VVar3 == INT) {
        VVar5.data.longValue = VVar5.data.longValue;
        VVar5.printType = INT;
        VVar5.type = INT;
        ArrayObject::changeValueAt((ArrayObject *)this_02.object,index,VVar5);
        this_01->pc = this_01->pc + 1;
        return;
      }
      __assert_fail("value.type == array->arrayContentType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x61b,"void ExecutionEngine::i_iastore()");
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(2);
  }
  __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x60c,"void ExecutionEngine::i_iastore()");
}

Assistant:

void ExecutionEngine::i_iastore() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::INT);
    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue >= array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    value.printType = ValueType::INT;
    
    assert(value.type == array->arrayContentType());
    array->changeValueAt(index.data.intValue, value);
    
    topFrame->pc += 1;
}